

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,REF_INT *nodes)

{
  uint uVar1;
  void *pvVar2;
  int local_48;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL reversed;
  REF_INT chunk;
  REF_INT orig;
  REF_INT seg;
  REF_INT node;
  REF_INT *nodes_local;
  REF_CAVITY ref_cavity_local;
  
  _seg = nodes;
  nodes_local = (REF_INT *)ref_cavity;
  uVar1 = ref_cavity_find_seg(ref_cavity,nodes,&chunk,&ref_private_macro_code_rss);
  if ((uVar1 == 0) || (uVar1 == 5)) {
    if (chunk == -1) {
      if (nodes_local[8] == -1) {
        reversed = nodes_local[7];
        if ((int)((double)reversed * 1.5) < 100) {
          local_48 = 100;
        }
        else {
          local_48 = (int)((double)reversed * 1.5);
        }
        ref_private_macro_code_rxs = local_48;
        nodes_local[7] = reversed + local_48;
        fflush(_stdout);
        if (0 < nodes_local[7] * 3) {
          pvVar2 = realloc(*(void **)(nodes_local + 10),(long)(nodes_local[7] * 3) << 2);
          *(void **)(nodes_local + 10) = pvVar2;
        }
        if (*(long *)(nodes_local + 10) == 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x107,"ref_cavity_insert_seg","realloc ref_cavity->s2n NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                 (ulong)(uint)(nodes_local[7] * 3),(long)(nodes_local[7] * 3),4,
                 (long)(nodes_local[7] * 3) << 2);
          return 2;
        }
        for (chunk = reversed; chunk < nodes_local[7]; chunk = chunk + 1) {
          *(undefined4 *)(*(long *)(nodes_local + 10) + (long)(chunk * 3) * 4) = 0xffffffff;
          *(REF_INT *)(*(long *)(nodes_local + 10) + (long)(chunk * 3 + 1) * 4) = chunk + 1;
        }
        *(undefined4 *)(*(long *)(nodes_local + 10) + (long)((nodes_local[7] + -1) * 3 + 1) * 4) =
             0xffffffff;
        nodes_local[8] = reversed;
      }
      chunk = nodes_local[8];
      nodes_local[8] = *(REF_INT *)(*(long *)(nodes_local + 10) + (long)(chunk * 3 + 1) * 4);
      for (orig = 0; orig < 2; orig = orig + 1) {
        *(REF_INT *)(*(long *)(nodes_local + 10) + (long)(orig + chunk * 3) * 4) = _seg[orig];
      }
      *(REF_INT *)(*(long *)(nodes_local + 10) + (long)(chunk * 3 + 2) * 4) = _seg[2];
      nodes_local[6] = nodes_local[6] + 1;
      ref_cavity_local._4_4_ = ref_cavity_add_seg_face((REF_CAVITY)nodes_local,_seg);
      if (ref_cavity_local._4_4_ == 0) {
        ref_cavity_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x118,"ref_cavity_insert_seg",(ulong)ref_cavity_local._4_4_,"add seg face");
      }
    }
    else if (ref_private_macro_code_rss == 0) {
      ref_cavity_local._4_4_ = 3;
    }
    else if (_seg[2] == *(int *)(*(long *)(nodes_local + 10) + (long)(chunk * 3 + 2) * 4)) {
      *(undefined4 *)(*(long *)(nodes_local + 10) + (long)(chunk * 3) * 4) = 0xffffffff;
      *(REF_INT *)(*(long *)(nodes_local + 10) + (long)(chunk * 3 + 1) * 4) = nodes_local[8];
      nodes_local[8] = chunk;
      nodes_local[6] = nodes_local[6] + -1;
      uVar1 = ref_cavity_remove_seg_face((REF_CAVITY)nodes_local,_seg);
      if (uVar1 == 0) {
        ref_cavity_local._4_4_ = ref_cavity_remove_seg_add_tets((REF_CAVITY)nodes_local,_seg);
        if (ref_cavity_local._4_4_ == 0) {
          ref_cavity_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0xf9,"ref_cavity_insert_seg",(ulong)ref_cavity_local._4_4_,"rm seg tets");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0xf8,"ref_cavity_insert_seg",(ulong)uVar1,"rm seg face");
        ref_cavity_local._4_4_ = uVar1;
      }
    }
    else {
      *nodes_local = 2;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0xea,
           "ref_cavity_insert_seg",(ulong)uVar1,"find existing");
    ref_cavity_local._4_4_ = uVar1;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,
                                         REF_INT *nodes) {
  REF_INT node, seg;
  REF_INT orig, chunk;
  REF_BOOL reversed;

  RXS(ref_cavity_find_seg(ref_cavity, nodes, &seg, &reversed), REF_NOT_FOUND,
      "find existing");

  if (REF_EMPTY != seg) {
    if (reversed) { /* two segs with opposite orientation destroy each other */
      if (nodes[2] != ref_cavity_s2n(ref_cavity, 2, seg)) {
        /* mixing faceid would violate topology */
        ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
        return REF_SUCCESS;
      }
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = ref_cavity_blankseg(ref_cavity);
      ref_cavity_blankseg(ref_cavity) = seg;

      ref_cavity_nseg(ref_cavity)--;
      RSS(ref_cavity_remove_seg_face(ref_cavity, nodes), "rm seg face");
      RSS(ref_cavity_remove_seg_add_tets(ref_cavity, nodes), "rm seg tets");

      return REF_SUCCESS;
    } else { /* can't happen, added same seg twice */
      return REF_INVALID;
    }
  }

  /* if I need to grow my array of segs */
  if (REF_EMPTY == ref_cavity_blankseg(ref_cavity)) {
    orig = ref_cavity_maxseg(ref_cavity);
    chunk = MAX(100, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_cavity_maxseg(ref_cavity) = orig + chunk;

    ref_realloc(ref_cavity->s2n, 3 * ref_cavity_maxseg(ref_cavity), REF_INT);

    for (seg = orig; seg < ref_cavity_maxseg(ref_cavity); seg++) {
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = seg + 1;
    }
    ref_cavity_s2n(ref_cavity, 1, (ref_cavity->maxseg) - 1) = REF_EMPTY;
    ref_cavity_blankseg(ref_cavity) = orig;
  }

  seg = ref_cavity_blankseg(ref_cavity);
  ref_cavity_blankseg(ref_cavity) = ref_cavity_s2n(ref_cavity, 1, seg);
  for (node = 0; node < 2; node++)
    ref_cavity_s2n(ref_cavity, node, seg) = nodes[node];
  ref_cavity_s2n(ref_cavity, 2, seg) = nodes[2]; /* faceid */

  ref_cavity_nseg(ref_cavity)++;
  RSS(ref_cavity_add_seg_face(ref_cavity, nodes), "add seg face");

  return REF_SUCCESS;
}